

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

ChildrenAnswers * __thiscall
IRT::PrintVisitor::VisitChildren
          (ChildrenAnswers *__return_storage_ptr__,PrintVisitor *this,
          vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *children)

{
  ulong uVar1;
  size_type sVar2;
  reference ppIVar3;
  string local_58 [48];
  int local_28;
  undefined1 local_21;
  int i;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *children_local;
  PrintVisitor *this_local;
  ChildrenAnswers *answers;
  
  local_21 = 0;
  _i = children;
  children_local = (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)this;
  this_local = (PrintVisitor *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x30);
  ChildrenAnswers::ChildrenAnswers(__return_storage_ptr__);
  for (local_28 = 0; uVar1 = (ulong)local_28,
      sVar2 = std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::size(children),
      uVar1 < sVar2; local_28 = local_28 + 1) {
    ppIVar3 = std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::operator[]
                        (children,(long)local_28);
    if (*ppIVar3 != (value_type)0x0) {
      ppIVar3 = std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::operator[]
                          (children,(long)local_28);
      (**(*ppIVar3)->_vptr_INode)(*ppIVar3,this);
      std::__cxx11::string::string(local_58,(string *)&this->description);
      ChildrenAnswers::PushBack(__return_storage_ptr__,(string *)local_58,this->lastVisited);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::operator=((string *)&this->description,"");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRT::ChildrenAnswers IRT::PrintVisitor::VisitChildren( std::vector<const INode *> children ) {
    ChildrenAnswers answers = ChildrenAnswers( );
    for ( int i = 0; i < children.size( ); i++ ) {
        if ( children[ i ] ) {
            children[ i ]->Accept( *this );
            answers.PushBack( this->description, lastVisited );
            this->description = "";
        }
    }
    return answers;
}